

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O3

void __thiscall QGroupBoxPrivate::calculateFrame(QGroupBoxPrivate *this)

{
  QWidget *this_00;
  QStyle *pQVar1;
  long in_FS_OFFSET;
  undefined1 auVar2 [16];
  QStyleOptionGroupBox box;
  QStyleOptionGroupBox QStack_a8;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  memset(&QStack_a8,0xaa,0x88);
  QStyleOptionGroupBox::QStyleOptionGroupBox(&QStack_a8);
  (**(code **)(*(long *)this_00 + 0x1a0))(this_00,&QStack_a8);
  pQVar1 = QWidget::style(this_00);
  auVar2 = (**(code **)(*(long *)pQVar1 + 0xd8))(pQVar1,7,&QStack_a8,4,this_00);
  QWidget::setContentsMargins
            (this_00,auVar2._0_4_ -
                     QStack_a8.super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i,
             auVar2._4_4_ - QStack_a8.super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i,
             QStack_a8.super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i - auVar2._8_4_,
             QStack_a8.super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i - auVar2._12_4_);
  QWidgetPrivate::setLayoutItemMargins
            (&this->super_QWidgetPrivate,SE_GroupBoxLayoutItem,(QStyleOption *)&QStack_a8);
  if (&(QStack_a8.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_a8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_a8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_a8.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_a8.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_a8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGroupBoxPrivate::calculateFrame()
{
    Q_Q(QGroupBox);
    QStyleOptionGroupBox box;
    q->initStyleOption(&box);
    QRect contentsRect = q->style()->subControlRect(QStyle::CC_GroupBox, &box, QStyle::SC_GroupBoxContents, q);
    q->setContentsMargins(contentsRect.left() - box.rect.left(), contentsRect.top() - box.rect.top(),
                          box.rect.right() - contentsRect.right(), box.rect.bottom() - contentsRect.bottom());
    setLayoutItemMargins(QStyle::SE_GroupBoxLayoutItem, &box);
}